

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

fy_token * fy_token_vcreate(fy_token_type type,__va_list_tag *ap)

{
  uint uVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fy_input *pfVar7;
  fy_token *pfVar8;
  undefined8 *local_100;
  uint *local_e8;
  uint *local_d0;
  uint *local_b8;
  uint *local_a0;
  uint *local_88;
  uint *local_70;
  long *local_50;
  fy_token *fyt_td;
  fy_atom *handle;
  fy_token *fyt;
  __va_list_tag *ap_local;
  fy_token_type type_local;
  
  handle = (fy_atom *)0x0;
  if ((FYTT_INPUT_MARKER < type) ||
     (handle = (fy_atom *)fy_token_alloc(), (fy_token *)handle == (fy_token *)0x0))
  goto LAB_001553b3;
  ((fy_token *)handle)->type = type;
  uVar1 = ap->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = local_50 + 1;
  }
  psVar2 = (size_t *)*local_50;
  if (psVar2 == (size_t *)0x0) goto LAB_001553b3;
  *(size_t *)&(((fy_token *)handle)->handle).increment = psVar2[6];
  sVar3 = *psVar2;
  sVar4 = psVar2[1];
  sVar5 = psVar2[2];
  sVar6 = psVar2[3];
  pfVar7 = (fy_input *)psVar2[5];
  (((fy_token *)handle)->handle).storage_hint = psVar2[4];
  (((fy_token *)handle)->handle).fyi = pfVar7;
  (((fy_token *)handle)->handle).end_mark.input_pos = sVar5;
  (((fy_token *)handle)->handle).end_mark.line = (int)sVar6;
  (((fy_token *)handle)->handle).end_mark.column = (int)(sVar6 >> 0x20);
  (((fy_token *)handle)->handle).start_mark.input_pos = sVar3;
  (((fy_token *)handle)->handle).start_mark.line = (int)sVar4;
  (((fy_token *)handle)->handle).start_mark.column = (int)(sVar4 >> 0x20);
  switch(((fy_token *)handle)->type) {
  case FYTT_NONE:
    break;
  default:
    goto LAB_00155370;
  case FYTT_TAG_DIRECTIVE:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_70 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_70 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 2;
    }
    (((fy_token *)handle)->field_9).tag_directive.tag_length = *local_70;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_88 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_88 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_88 + 2;
    }
    (((fy_token *)handle)->field_9).tag_directive.uri_length = *local_88;
LAB_00155370:
    if ((((fy_token *)handle)->handle).fyi != (fy_input *)0x0) {
      fy_input_ref((((fy_token *)handle)->handle).fyi);
      return (fy_token *)handle;
    }
    __assert_fail("fyt->handle.fyi",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                  ,0x146,
                  "struct fy_token *fy_token_vcreate(enum fy_token_type, struct __va_list_tag *)");
  case FYTT_TAG:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_b8 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_b8 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_b8 + 2;
    }
    (((fy_token *)handle)->field_9).tag_directive.tag_length = *local_b8;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_d0 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_d0 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_d0 + 2;
    }
    (((fy_token *)handle)->field_9).tag_directive.uri_length = *local_d0;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_e8 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_e8 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_e8 + 2;
    }
    (((fy_token *)handle)->field_9).tag.suffix_length = *local_e8;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_100 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_100 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_100 + 1;
    }
    if ((fy_token *)*local_100 != (fy_token *)0x0) {
      pfVar8 = fy_token_ref((fy_token *)*local_100);
      (((fy_token *)handle)->field_9).tag.fyt_td = pfVar8;
      goto LAB_00155370;
    }
    break;
  case FYTT_SCALAR:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_a0 = (uint *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_a0 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_a0 + 2;
    }
    (((fy_token *)handle)->field_9).tag_directive.tag_length = *local_a0;
    if ((((fy_token *)handle)->field_9).tag_directive.tag_length < 5) goto LAB_00155370;
  }
LAB_001553b3:
  fy_token_unref((fy_token *)handle);
  return (fy_token *)0x0;
}

Assistant:

struct fy_token *fy_token_vcreate(enum fy_token_type type, va_list ap) {
    struct fy_token *fyt = NULL;
    struct fy_atom *handle;
    struct fy_token *fyt_td;

    if ((unsigned int) type > FYTT_INPUT_MARKER)
        goto err_out;

    fyt = fy_token_alloc();
    if (!fyt)
        goto err_out;
    fyt->type = type;

    handle = va_arg(ap, struct fy_atom *);
    if (!handle)
        goto err_out;
    fyt->handle = *handle;

    switch (fyt->type) {
        case FYTT_TAG_DIRECTIVE:
            fyt->tag_directive.tag_length = va_arg(ap, unsigned int);
            fyt->tag_directive.uri_length = va_arg(ap, unsigned int);
            break;
        case FYTT_SCALAR:
            fyt->scalar.style = va_arg(ap, enum fy_scalar_style);
            if ((unsigned int) fyt->scalar.style >= FYSS_MAX)
                goto err_out;
            break;
        case FYTT_TAG:
            fyt->tag.skip = va_arg(ap, unsigned int);
            fyt->tag.handle_length = va_arg(ap, unsigned int);
            fyt->tag.suffix_length = va_arg(ap, unsigned int);

            fyt_td = va_arg(ap, struct fy_token *);
            if (!fyt_td)
                goto err_out;
            fyt->tag.fyt_td = fy_token_ref(fyt_td);
            break;

        case FYTT_NONE:
            goto err_out;

        default:
            break;
    }

    assert(fyt->handle.fyi);

    /* take reference */
    fy_input_ref(fyt->handle.fyi);

    return fyt;

    err_out:
    fy_token_unref(fyt);

    return NULL;
}